

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::printFailure(JUnitTestOutput *this,TestFailure *failure)

{
  TestFailure *this_00;
  TestFailure *failure_local;
  JUnitTestOutput *this_local;
  
  if (((this->impl_->results_).tail_)->failure_ == (TestFailure *)0x0) {
    (this->impl_->results_).failureCount_ = (this->impl_->results_).failureCount_ + 1;
    this_00 = (TestFailure *)
              operator_new(0x68,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                           ,0x133);
    TestFailure::TestFailure(this_00,failure);
    ((this->impl_->results_).tail_)->failure_ = this_00;
  }
  return;
}

Assistant:

void JUnitTestOutput::printFailure(const TestFailure& failure)
{
    if (impl_->results_.tail_->failure_ == NULLPTR) {
        impl_->results_.failureCount_++;
        impl_->results_.tail_->failure_ = new TestFailure(failure);
    }
}